

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# karatsubaMultiplication.cpp
# Opt level: O2

Num * __thiscall
karatsubaMultiplication::multiply
          (Num *__return_storage_ptr__,karatsubaMultiplication *this,Num *n1,Num *n2)

{
  Num *this_00;
  Short SVar1;
  Short length;
  Short SVar2;
  Short SVar3;
  Num tk1;
  Num b_b;
  Num t_2m;
  Num a_a;
  Num tk2;
  Num x1;
  Halves a;
  Num x3;
  string str_t;
  Num x2;
  Halves b;
  Num NStack_2a8;
  undefined1 local_280 [40];
  Num local_258;
  undefined1 local_230 [40];
  Num local_208;
  Halves local_1e0;
  pair<Num,_Num> local_190;
  Num local_140;
  string local_118;
  Num local_f8;
  pair<Num,_Num> local_d0;
  Num local_80;
  Num local_58;
  
  SVar1 = Num::getSize(n1);
  length = Num::getSize(n2);
  if (length < SVar1) {
    length = SVar1;
  }
  SVar1 = Num::getSize(n1);
  if ((SVar1 != 1) && (SVar1 = Num::getSize(n2), SVar1 != 1)) {
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_190);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_d0);
    Num::getHalf(&local_1e0,n1,length);
    std::pair<Num,_Num>::operator=(&local_190,&local_1e0);
    std::pair<Num,_Num>::~pair(&local_1e0);
    Num::getHalf(&local_1e0,n2,length);
    std::pair<Num,_Num>::operator=(&local_d0,&local_1e0);
    std::pair<Num,_Num>::~pair(&local_1e0);
    Num::Num(&local_1e0.first);
    Num::Num(&local_f8);
    Num::Num(&local_140);
    multiply((Num *)local_230,this,&local_190.first,&local_d0.first);
    Num::operator=(&local_1e0.first,(Num *)local_230);
    Num::~Num((Num *)local_230);
    Num::Num((Num *)local_230);
    SVar1 = Num::getNumber(&local_190.first);
    SVar2 = Num::getNumber(&local_190.second);
    Num::operator+((Num *)local_280,&local_190.first,&local_190.second);
    local_230._0_2_ = Num::getSize((Num *)local_280);
    Num::~Num((Num *)local_280);
    std::__cxx11::to_string((string *)local_280,(uint)SVar2 + (uint)SVar1);
    std::__cxx11::string::operator=((string *)(local_230 + 8),(string *)local_280);
    std::__cxx11::string::~string((string *)local_280);
    Num::Num((Num *)local_280);
    SVar1 = Num::getNumber(&local_d0.first);
    this_00 = &local_d0.second;
    SVar2 = Num::getNumber(this_00);
    Num::operator+(&NStack_2a8,&local_d0.first,this_00);
    local_280._0_2_ = Num::getSize(&NStack_2a8);
    Num::~Num(&NStack_2a8);
    std::__cxx11::to_string((string *)&NStack_2a8,(uint)SVar2 + (uint)SVar1);
    std::__cxx11::string::operator=((string *)(local_280 + 8),(string *)&NStack_2a8);
    std::__cxx11::string::~string((string *)&NStack_2a8);
    Num::operator+(&local_258,&local_190.first,&local_190.second);
    Num::operator+(&local_208,&local_d0.first,this_00);
    multiply(&NStack_2a8,this,&local_258,&local_208);
    Num::operator=(&local_f8,&NStack_2a8);
    Num::~Num(&NStack_2a8);
    Num::~Num(&local_208);
    Num::~Num(&local_258);
    multiply(&NStack_2a8,this,&local_190.second,this_00);
    Num::operator=(&local_140,&NStack_2a8);
    Num::~Num(&NStack_2a8);
    SVar1 = Num::getNumber(&local_f8);
    SVar2 = Num::getNumber(&local_1e0.first);
    SVar3 = Num::getNumber(&local_140);
    std::__cxx11::to_string(&local_118,(uint)SVar1 - ((uint)SVar3 + (uint)SVar2));
    Num::multiplyByPowerOfTen(&NStack_2a8,&local_1e0.first,length);
    Num::Num(&local_258,&local_118,(Short)local_118._M_string_length);
    Num::multiplyByPowerOfTen(&local_208,&local_258,length >> 1);
    Num::multiplyByPowerOfTen(&local_80,&local_258,length >> 1);
    Num::operator+(&local_58,&NStack_2a8,&local_80);
    Num::operator+(__return_storage_ptr__,&local_58,&local_140);
    Num::~Num(&local_58);
    Num::~Num(&local_80);
    Num::~Num(&local_208);
    Num::~Num(&local_258);
    Num::~Num(&NStack_2a8);
    std::__cxx11::string::~string((string *)&local_118);
    Num::~Num((Num *)local_280);
    Num::~Num((Num *)local_230);
    Num::~Num(&local_140);
    Num::~Num(&local_f8);
    Num::~Num(&local_1e0.first);
    std::pair<Num,_Num>::~pair(&local_d0);
    std::pair<Num,_Num>::~pair(&local_190);
    return __return_storage_ptr__;
  }
  gradeSchoolMultiplication::gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_190);
  gradeSchoolMultiplication::multiply
            (__return_storage_ptr__,(gradeSchoolMultiplication *)&local_190,n1,n2);
  gradeSchoolMultiplication::~gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

Num karatsubaMultiplication :: multiply(const Num& n1, const Num& n2)
{
    Short m = std::max(n1.getSize(), n2.getSize());
    if (n1.getSize() == 1 || n2.getSize()== 1)
    {
        gradeSchoolMultiplication t;
        return t.multiply(n1, n2);
    }

    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3;
    x1 = karatsubaMultiplication ::multiply(a.first, b.first);
    Num a_a;
    int per = a.first.getNumber() + a.second.getNumber();
    a_a.size = (a.first + a.second).getSize();
    a_a.base = std::to_string(per);

    Num b_b;
    int per1 = b.first.getNumber() + b.second.getNumber();
    b_b.size = (b.first + b.second).getSize();
    b_b.base = std::to_string(per1);

    x2 = karatsubaMultiplication ::multiply(a.first + a.second, b.first + b.second);
    x3 = karatsubaMultiplication ::multiply(a.second, b.second);

    int t_x2 = x2.getNumber() - x1.getNumber() - x3.getNumber();

    std::string str_t = std::to_string(t_x2);


    Num tk1 = x1.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num tk2 = t_2m.multiplyByPowerOfTen(m/2);

    Num x4 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x3;

    return x4;
}